

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O3

void duckdb::DateToStringCast::Format
               (char *data,int32_t year,int32_t month,int32_t day,idx_t year_length,bool add_bc)

{
  char *pcVar1;
  char *ptr;
  char cVar2;
  
  ptr = data + year_length;
  pcVar1 = NumericHelper::FormatUnsigned<int>(year,ptr);
  if (data <= pcVar1 && (long)pcVar1 - (long)data != 0) {
    switchD_01043a80::default(data,0x30,(long)pcVar1 - (long)data);
  }
  *ptr = '-';
  if (month < 10) {
    ptr[1] = '0';
    cVar2 = (char)month + '0';
  }
  else {
    cVar2 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)month * 2 + 1];
    ptr[1] = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)month * 2];
  }
  ptr[2] = cVar2;
  ptr[3] = '-';
  if (day < 10) {
    ptr[4] = '0';
    cVar2 = (char)day + '0';
  }
  else {
    cVar2 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)day * 2 + 1];
    ptr[4] = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)day * 2];
  }
  ptr[5] = cVar2;
  if (add_bc) {
    builtin_strncpy(data + year_length + 6," (BC)",5);
  }
  return;
}

Assistant:

static void Format(char *data, int32_t year, int32_t month, int32_t day, idx_t year_length, bool add_bc) {
		// now we write the string, first write the year
		auto endptr = data + year_length;
		endptr = NumericHelper::FormatUnsigned(year, endptr);
		// add optional leading zeros
		while (endptr > data) {
			*--endptr = '0';
		}
		// now write the month and day
		auto ptr = data + year_length;
		FormatComponent(ptr, month);
		FormatComponent(ptr, day);
		// optionally add BC to the end of the date
		if (add_bc) {
			memcpy(ptr, " (BC)", 5); // NOLINT
		}
	}